

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-make.c
# Opt level: O3

int16_t place_monster(chunk *c,loc grid,monster_conflict *mon,uint8_t origin)

{
  bitflag *flags;
  undefined2 uVar1;
  undefined2 uVar2;
  monster_drop *pmVar3;
  _Bool _Var4;
  _Bool _Var5;
  _Bool _Var6;
  _Bool _Var7;
  _Bool _Var8;
  uint8_t uVar9;
  short sVar10;
  wchar_t wVar11;
  wchar_t wVar12;
  uint32_t uVar13;
  monster *pmVar14;
  monster_conflict *mon_00;
  monster_conflict *pmVar15;
  monster_lore *pmVar16;
  monster_race *pmVar17;
  quest *pqVar18;
  object_kind *k;
  object *poVar19;
  monster_race *pmVar20;
  wchar_t wVar21;
  wchar_t idx;
  quest_artifact *arts;
  quest_artifact *pqVar22;
  wchar_t wVar23;
  artifact *paVar24;
  _Bool local_6d;
  
  wVar11 = mon->midx;
  _Var4 = square_in_bounds((chunk_conflict *)c,grid);
  if (!_Var4) {
    __assert_fail("square_in_bounds(c, grid)",
                  "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/mon-make.c"
                  ,0x6bd,
                  "int16_t place_monster(struct chunk *, struct loc, struct monster *, uint8_t)");
  }
  pmVar14 = square_monster((chunk_conflict *)c,grid);
  if (pmVar14 != (monster *)0x0) {
    __assert_fail("!square_monster(c, grid)",
                  "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/mon-make.c"
                  ,0x6be,
                  "int16_t place_monster(struct chunk *, struct loc, struct monster *, uint8_t)");
  }
  if (wVar11 < L'\x01') {
    sVar10 = mon_pop(c);
    if (sVar10 == 0) {
      return 0;
    }
  }
  else {
    sVar10 = (short)mon->midx;
    uVar1 = c->mon_max;
    uVar2 = c->mon_cnt;
    c->mon_max = uVar1 + 1;
    c->mon_cnt = uVar2 + 1;
  }
  idx = (wchar_t)sVar10;
  mon_00 = (monster_conflict *)cave_monster((chunk_conflict *)c,idx);
  memcpy(mon_00,mon,0x1f0);
  mon_00->midx = idx;
  square_set_mon((chunk_conflict *)c,grid,idx);
  mon_00->grid = grid;
  pmVar15 = (monster_conflict *)square_monster((chunk_conflict *)c,grid);
  if (pmVar15 != mon_00) {
    __assert_fail("square_monster(c, grid) == new_mon",
                  "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/mon-make.c"
                  ,0x6d4,
                  "int16_t place_monster(struct chunk *, struct loc, struct monster *, uint8_t)");
  }
  monster_group_assign((chunk_conflict *)c,(monster *)mon_00,mon->group_info,L'\0' < wVar11);
  update_mon(mon_00,c,true);
  _Var4 = flag_has_dbg(mon_00->race->flags,0xc,0x17,"new_mon->race->flags","RF_MULTIPLY");
  if (_Var4) {
    c->num_repro = c->num_repro + L'\x01';
  }
  pmVar17 = mon_00->original_race;
  if (pmVar17 == (monster_race *)0x0) {
    pmVar17 = mon_00->race;
  }
  pmVar17->cur_num = pmVar17->cur_num + L'\x01';
  if (origin != '\0') {
    pmVar16 = get_lore(mon_00->race);
    pmVar17 = mon_00->original_race;
    if (pmVar17 == (monster_race *)0x0) {
      pmVar17 = mon_00->race;
    }
    flags = pmVar17->flags;
    _Var4 = flag_has_dbg(flags,0xc,0x31,"effective_race->flags","RF_DROP_GREAT");
    local_6d = true;
    if (!_Var4) {
      local_6d = flag_has_dbg(flags,0xc,0x30,"effective_race->flags","RF_DROP_GOOD");
    }
    _Var5 = flag_has_dbg(flags,0xc,0x29,"effective_race->flags","RF_ONLY_ITEM");
    _Var6 = flag_has_dbg(flags,0xc,0x28,"effective_race->flags","RF_ONLY_GOLD");
    wVar11 = mon_create_drop_count(pmVar17,false,false,(int *)0x0);
    _Var7 = monster_is_unique((monster *)mon_00);
    if (_Var7) {
      wVar21 = wVar11 - (uint)pmVar16->thefts;
      wVar11 = L'\0';
      if (L'\0' < wVar21) {
        wVar11 = wVar21;
      }
    }
    wVar21 = pmVar17->level;
    _Var7 = monster_is_unique((monster *)mon_00);
    wVar23 = wVar21;
    if (_Var7) {
      wVar23 = wVar21 * 2;
      if (wVar21 + L'\x0f' < wVar21 * 2) {
        wVar23 = wVar21 + L'\x0f';
      }
    }
    wVar21 = (c->depth + wVar23) / 2;
    if (wVar21 <= wVar23) {
      wVar21 = wVar23;
    }
    wVar23 = L'd';
    if (wVar21 < L'd') {
      wVar23 = wVar21;
    }
    _Var8 = quest_unique_monster_check(pmVar17);
    if ((_Var8) && (pqVar18 = find_quest((int)player->place), pqVar18 != (quest *)0x0)) {
      for (pqVar22 = pqVar18->arts; paVar24 = a_info, pqVar22 != (quest_artifact *)0x0;
          pqVar22 = pqVar22->next) {
        wVar21 = pqVar22->index;
        k = lookup_kind(a_info[wVar21].tval,a_info[wVar21].sval);
        wVar12 = Rand_div(100);
        if (wVar12 < pqVar22->chance) {
          paVar24 = paVar24 + wVar21;
          poVar19 = (object *)mem_zalloc(0x148);
          object_prep(poVar19,k,L'd',RANDOMISE);
          poVar19->artifact = paVar24;
          copy_artifact_data(poVar19,paVar24);
          mark_artifact_created(paVar24,true);
          poVar19->origin = origin;
          uVar9 = convert_depth_to_origin(c->depth);
          poVar19->origin_depth = uVar9;
          poVar19->origin_place = (int16_t)c->place;
          _Var8 = flag_has_dbg(flags,0xc,2,"race->flags","RF_PLAYER_GHOST");
          pmVar20 = pmVar17;
          if (_Var8) {
            pmVar20 = r_info + pmVar17->ridx;
          }
          poVar19->origin_race = pmVar20;
          poVar19->number = '\x01';
          _Var8 = monster_carry(c,mon_00,poVar19);
          if (!_Var8) {
            mark_artifact_created(poVar19->artifact,false);
            object_wipe(poVar19);
            mem_free(poVar19);
          }
        }
      }
    }
    for (pmVar3 = pmVar17->drops; pmVar3 != (monster_drop *)0x0; pmVar3 = pmVar3->next) {
      uVar13 = Rand_div(100);
      if (uVar13 < pmVar3->percent_chance) {
        if (pmVar3->kind == (object_kind *)0x0) {
          if (pmVar3->tval == L'\0') {
            __assert_fail("drop->tval",
                          "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/mon-make.c"
                          ,0x5d6,"_Bool mon_create_drop(struct chunk *, struct monster *, uint8_t)")
            ;
          }
          poVar19 = make_object(c,wVar23,local_6d,_Var4,_Var7,(int32_t *)0x0,pmVar3->tval);
        }
        else {
          poVar19 = (object *)mem_zalloc(0x148);
          object_prep(poVar19,pmVar3->kind,wVar23,RANDOMISE);
          apply_magic(poVar19,wVar23,true,local_6d,_Var4,_Var7);
        }
        if (poVar19 != (object *)0x0) {
          poVar19->origin = origin;
          uVar9 = convert_depth_to_origin(c->depth);
          poVar19->origin_depth = uVar9;
          poVar19->origin_place = (int16_t)c->place;
          _Var8 = flag_has_dbg(flags,0xc,2,"race->flags","RF_PLAYER_GHOST");
          pmVar20 = pmVar17;
          if (_Var8) {
            pmVar20 = r_info + pmVar17->ridx;
          }
          poVar19->origin_race = pmVar20;
          uVar9 = '\x01';
          if (poVar19->artifact == (artifact *)0x0) {
            uVar13 = Rand_div(pmVar3->max - pmVar3->min);
            uVar9 = (char)uVar13 + (char)pmVar3->min;
          }
          poVar19->number = uVar9;
          _Var8 = monster_carry(c,mon_00,poVar19);
          if (!_Var8) {
            object_wipe(poVar19);
            mem_free(poVar19);
          }
        }
      }
    }
    if (L'\0' < wVar11) {
      do {
        if ((_Var5) || ((!_Var6 && (uVar13 = Rand_div(100), 0x31 < (int)uVar13)))) {
          poVar19 = make_object(c,wVar23,local_6d,_Var4,_Var7,(int32_t *)0x0,L'\0');
          if (poVar19 != (object *)0x0) goto LAB_0017d96d;
        }
        else {
          poVar19 = make_gold(wVar23,"any");
LAB_0017d96d:
          poVar19->origin = origin;
          uVar9 = convert_depth_to_origin(c->depth);
          poVar19->origin_depth = uVar9;
          poVar19->origin_place = (int16_t)c->place;
          _Var8 = flag_has_dbg(flags,0xc,2,"race->flags","RF_PLAYER_GHOST");
          pmVar20 = pmVar17;
          if (_Var8) {
            pmVar20 = r_info + pmVar17->ridx;
          }
          poVar19->origin_race = pmVar20;
          _Var8 = monster_carry(c,mon_00,poVar19);
          if (!_Var8) {
            if (poVar19->artifact != (artifact *)0x0) {
              mark_artifact_created(poVar19->artifact,false);
            }
            object_wipe(poVar19);
            mem_free(poVar19);
          }
        }
        wVar11 = wVar11 + L'\xffffffff';
      } while (wVar11 != L'\0');
    }
    if (mon_00->race->mimic_kinds != (monster_mimic *)0x0) {
      mon_create_mimicked_object(c,mon_00,idx);
    }
  }
  return sVar10;
}

Assistant:

int16_t place_monster(struct chunk *c, struct loc grid, struct monster *mon,
		uint8_t origin)
{
	int16_t m_idx;
	struct monster *new_mon;
	struct monster_group_info *info = mon->group_info;
	bool loading = mon->midx > 0;

	assert(square_in_bounds(c, grid));
	assert(!square_monster(c, grid));

	/* Get a new record, or recycle the old one */
	if (loading) {
		m_idx = mon->midx;
		c->mon_max++;
		c->mon_cnt++;
	} else {
		m_idx = mon_pop(c);
		if (!m_idx) return 0;
	}

	/* Copy the monster */
	new_mon = cave_monster(c, m_idx);
	memcpy(new_mon, mon, sizeof(struct monster));

	/* Set the ID */
	new_mon->midx = m_idx;

	/* Set the location */
	square_set_mon(c, grid, new_mon->midx);
	new_mon->grid = grid;
	assert(square_monster(c, grid) == new_mon);

	/* Assign monster to its monster group, or update its entry */
	monster_group_assign(c, new_mon, info, loading);

	update_mon(new_mon, c, true);

	/* Count the number of "reproducers" */
	if (rf_has(new_mon->race->flags, RF_MULTIPLY)) c->num_repro++;

	/* Count racial occurrences */
	if (new_mon->original_race) new_mon->original_race->cur_num++;
	else new_mon->race->cur_num++;

	/* Create the monster's drop, if any */
	if (origin)
		(void)mon_create_drop(c, new_mon, origin);

	/* Make mimics start mimicking */
	if (origin && new_mon->race->mimic_kinds) {
		mon_create_mimicked_object(c, new_mon, m_idx);
	}

	/* Result */
	return m_idx;
}